

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::MapTextureSubresource
          (DeviceContextVkImpl *this,ITexture *pTexture,Uint32 MipLevel,Uint32 ArraySlice,
          MAP_TYPE MapType,MAP_FLAGS MapFlags,Box *pMapRegion,MappedTextureSubresource *MappedData)

{
  byte bVar1;
  uint uVar2;
  undefined *puVar3;
  MAP_FLAGS MVar4;
  bool bVar5;
  CPU_ACCESS_FLAGS CVar6;
  Uint32 UVar7;
  type tVar8;
  type tVar9;
  TextureVkImpl *this_00;
  TextureDesc *TexDesc_00;
  TextureFormatAttribs *this_01;
  undefined8 uVar10;
  RenderDeviceVkImpl *this_02;
  VulkanPhysicalDevice *this_03;
  VkPhysicalDeviceProperties *pVVar11;
  unsigned_long *puVar12;
  Uint8 *pUVar13;
  long lVar14;
  VkDeviceSize Offset;
  uint8_t *puVar15;
  Char *pCVar16;
  char (*Args_1) [56];
  char (*Args_1_00) [77];
  char (*Args_2) [77];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false,_false>,_bool>
  pVar17;
  char (*in_stack_fffffffffffffc68) [26];
  Char *local_300;
  undefined1 local_2f8 [8];
  string msg_3;
  string msg_2;
  Uint64 MapEndOffset;
  Uint32 BlockAlignedMaxY;
  Uint32 BlockAlignedMaxX;
  string msg_1;
  string msg;
  string _msg_2;
  Uint64 MapStartOffset;
  MipLevelProperties MipLevelAttribs_1;
  Uint64 SubresourceOffset;
  string _msg_1;
  MappedTexture local_1d8;
  MappedTextureKey local_170;
  _Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
  local_160;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false,_false>,_bool>
  it;
  VulkanDynamicAllocation Allocation;
  unsigned_long local_128;
  unsigned_long local_120;
  VkDeviceSize Alignment;
  BufferToTextureCopyInfo CopyInfo;
  VkPhysicalDeviceLimits *DeviceLimits;
  undefined1 local_c0 [8];
  string _msg;
  Uint64 local_98;
  Uint64 local_90;
  undefined1 local_88 [8];
  MipLevelProperties MipLevelAttribs;
  Box FullExtentBox;
  TextureFormatAttribs *FmtAttribs;
  TextureDesc *TexDesc;
  TextureVkImpl *TextureVk;
  Uint32 local_20;
  MAP_FLAGS MapFlags_local;
  Uint32 UStack_1c;
  MAP_TYPE MapType_local;
  Uint32 ArraySlice_local;
  Uint32 MipLevel_local;
  ITexture *pTexture_local;
  DeviceContextVkImpl *this_local;
  
  Args_1 = (char (*) [56])(ulong)ArraySlice;
  Args_2 = (char (*) [77])(ulong)MapType;
  local_20 = ArraySlice;
  UStack_1c = MipLevel;
  _ArraySlice_local = pTexture;
  pTexture_local = (ITexture *)this;
  DeviceContextBase<Diligent::EngineVkImplTraits>::MapTextureSubresource
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture,MipLevel,ArraySlice,
             MapType,MapFlags,pMapRegion,MappedData);
  this_00 = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(_ArraySlice_local);
  TexDesc_00 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
               ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          *)this_00);
  this_01 = GetTextureFormatAttribs(TexDesc_00->Format);
  Box::Box((Box *)&MipLevelAttribs.MipSize);
  if (pMapRegion == (Box *)0x0) {
    GetMipLevelProperties((MipLevelProperties *)local_88,TexDesc_00,UStack_1c);
    MipLevelAttribs.MipSize._4_4_ = local_88._0_4_;
    pMapRegion = (Box *)&MipLevelAttribs.MipSize;
  }
  if (TexDesc_00->Usage == USAGE_DYNAMIC) {
    if (MapType == MAP_WRITE) {
      MVar4 = Diligent::operator|(MAP_FLAG_DISCARD,MAP_FLAG_NO_OVERWRITE);
      MVar4 = Diligent::operator&(MapFlags,MVar4);
      if ((MVar4 != MAP_FLAG_NONE) && ((MapTextureSubresource::IsFirstTime & 1U) != 0)) {
        FormatString<char[102]>
                  ((string *)local_c0,
                   (char (*) [102])
                   "Mapping textures with flags MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE has no effect in Vulkan backend"
                  );
        puVar3 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar10 = std::__cxx11::string::c_str();
          (*(code *)puVar3)(0,uVar10,0);
        }
        std::__cxx11::string::~string((string *)local_c0);
        MapTextureSubresource::IsFirstTime = false;
      }
      this_02 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                          (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
      this_03 = RenderDeviceVkImpl::GetPhysicalDevice(this_02);
      pVVar11 = VulkanUtilities::VulkanPhysicalDevice::GetProperties(this_03);
      CopyInfo.Region._16_8_ = &pVVar11->limits;
      GetBufferToTextureCopyInfo
                ((BufferToTextureCopyInfo *)&Alignment,TexDesc_00->Format,pMapRegion,
                 (Uint32)(pVVar11->limits).optimalBufferCopyRowPitchAlignment);
      local_128 = 4;
      puVar12 = std::max<unsigned_long>
                          ((unsigned_long *)(CopyInfo.Region._16_8_ + 0x1e0),&local_128);
      local_120 = *puVar12;
      if (this_01->ComponentType == COMPONENT_TYPE_COMPRESSED) {
        Allocation.dvpFrameNumber = (Uint64)this_01->ComponentSize;
        puVar12 = std::max<unsigned_long>(&local_120,&Allocation.dvpFrameNumber);
        local_120 = *puVar12;
      }
      AllocateDynamicSpace
                ((VulkanDynamicAllocation *)&it.second,this,CopyInfo.DepthStride,(Uint32)local_120);
      bVar5 = VulkanDynamicAllocation::operator_cast_to_bool((VulkanDynamicAllocation *)&it.second);
      if (bVar5) {
        pUVar13 = VulkanDynamicMemoryManager::GetCPUAddress((VulkanDynamicMemoryManager *)it._8_8_);
        MappedData->pData = pUVar13 + (long)Allocation.pDynamicMemMgr;
        MappedData->Stride = CopyInfo.RowSize;
        MappedData->DepthStride = CopyInfo._16_8_;
        local_170.MipLevel = UStack_1c;
        local_170.ArraySlice = local_20;
        local_1d8.CopyInfo.Region.MinY = CopyInfo.Region.MinX;
        local_1d8.CopyInfo.Region.MaxY = CopyInfo.Region.MaxX;
        local_1d8.CopyInfo.Region.MinZ = CopyInfo.Region.MinY;
        local_1d8.CopyInfo.Region.MaxZ = CopyInfo.Region.MaxY;
        local_1d8.CopyInfo.MemorySize = CopyInfo.DepthStride;
        local_1d8.CopyInfo.Region.MinX = (undefined4)CopyInfo.MemorySize;
        local_1d8.CopyInfo.Region.MaxX = CopyInfo.MemorySize._4_4_;
        local_1d8.CopyInfo.RowStrideInTexels = (undefined4)CopyInfo.RowStride;
        local_1d8.CopyInfo.RowCount = CopyInfo.RowStride._4_4_;
        local_1d8.CopyInfo.DepthStride._0_4_ = CopyInfo.RowStrideInTexels;
        local_1d8.CopyInfo.DepthStride._4_4_ = CopyInfo.RowCount;
        local_1d8.CopyInfo.RowSize = Alignment;
        local_1d8.CopyInfo.RowStride = CopyInfo.RowSize;
        local_170.Texture = this_00;
        VulkanDynamicAllocation::VulkanDynamicAllocation
                  (&local_1d8.Allocation,(VulkanDynamicAllocation *)&it.second);
        pVar17 = std::
                 unordered_map<Diligent::DeviceContextVkImpl::MappedTextureKey,Diligent::DeviceContextVkImpl::MappedTexture,Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,std::allocator<std::pair<Diligent::DeviceContextVkImpl::MappedTextureKey_const,Diligent::DeviceContextVkImpl::MappedTexture>>>
                 ::
                 emplace<Diligent::DeviceContextVkImpl::MappedTextureKey,Diligent::DeviceContextVkImpl::MappedTexture>
                           ((unordered_map<Diligent::DeviceContextVkImpl::MappedTextureKey,Diligent::DeviceContextVkImpl::MappedTexture,Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,std::allocator<std::pair<Diligent::DeviceContextVkImpl::MappedTextureKey_const,Diligent::DeviceContextVkImpl::MappedTexture>>>
                             *)&this->m_MappedTextures,&local_170,&local_1d8);
        _msg_1.field_2._8_8_ =
             pVar17.first.
             super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
             ._M_cur;
        it.first.
        super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
        ._M_cur._0_1_ = pVar17.second;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          local_160._M_cur = (__node_type *)_msg_1.field_2._8_8_;
          FormatString<char[11],unsigned_int,char[9],unsigned_int,char[14],char_const*,char[26]>
                    ((string *)&SubresourceOffset,(Diligent *)"Mip level ",
                     (char (*) [11])&stack0xffffffffffffffe4,(uint *)", slice ",
                     (char (*) [9])&local_20,(uint *)0xe40174,(char (*) [14])TexDesc_00,
                     (char **)"\' has already been mapped",in_stack_fffffffffffffc68);
          puVar3 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar10 = std::__cxx11::string::c_str();
            (*(code *)puVar3)(2,uVar10,0);
          }
          std::__cxx11::string::~string((string *)&SubresourceOffset);
        }
      }
    }
    else {
      LogError<false,char[66]>
                (false,"MapTextureSubresource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xa8b,(char (*) [66])
                        "Dynamic textures can be mapped for writing only in Vulkan backend");
      MappedTextureSubresource::MappedTextureSubresource
                ((MappedTextureSubresource *)((long)&_msg.field_2 + 8));
      MappedData->pData = (PVoid)_msg.field_2._8_8_;
      MappedData->Stride = local_98;
      MappedData->DepthStride = local_90;
    }
  }
  else if (TexDesc_00->Usage == USAGE_STAGING) {
    MipLevelAttribs_1.MipSize =
         GetStagingTextureSubresourceOffset(TexDesc_00,local_20,UStack_1c,0x10);
    GetMipLevelProperties((MipLevelProperties *)&MapStartOffset,TexDesc_00,UStack_1c);
    lVar14 = MipLevelAttribs_1.MipSize +
             ((ulong)(pMapRegion->MinZ * MipLevelAttribs_1.LogicalHeight + pMapRegion->MinY) /
             (ulong)this_01->BlockHeight) * MipLevelAttribs_1._16_8_;
    uVar2 = pMapRegion->MinX;
    bVar1 = this_01->BlockWidth;
    UVar7 = TextureFormatAttribs::GetElementSize(this_01);
    Offset = lVar14 + ((ulong)uVar2 / (ulong)bVar1) * (ulong)UVar7;
    puVar15 = TextureVkImpl::GetStagingDataCPUAddress(this_00);
    MappedData->pData = puVar15 + Offset;
    MappedData->Stride = MipLevelAttribs_1._16_8_;
    MappedData->DepthStride = MipLevelAttribs_1.RowSize;
    if (MapType == MAP_READ) {
      MVar4 = Diligent::operator&(MapFlags,MAP_FLAG_DO_NOT_WAIT);
      Args_1_00 = (char (*) [77])MipLevelAttribs_1.RowSize;
      if (MVar4 == MAP_FLAG_NONE) {
        FormatString<char[208]>
                  ((string *)((long)&msg.field_2 + 8),
                   (char (*) [208])
                   "Vulkan backend never waits for GPU when mapping staging textures for reading. Applications must use fences or other synchronization methods to explicitly synchronize access and use MAP_FLAG_DO_NOT_WAIT flag."
                  );
        puVar3 = DebugMessageCallback;
        Args_1_00 = (char (*) [77])MipLevelAttribs_1.RowSize;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar10 = std::__cxx11::string::c_str();
          Args_1_00 = (char (*) [77])0x0;
          Args_2 = Args_1_00;
          (*(code *)puVar3)(1,uVar10,0);
        }
        std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
      }
      CVar6 = Diligent::operator&(TexDesc_00->CPUAccessFlags,CPU_ACCESS_READ);
      if (CVar6 == CPU_ACCESS_NONE) {
        FormatString<char[10],char_const*,char[76]>
                  ((string *)((long)&msg_1.field_2 + 8),(Diligent *)0xf4cd7e,
                   (char (*) [10])TexDesc_00,
                   (char **)
                   "\' was not created with CPU_ACCESS_READ flag and can\'t be mapped for reading",
                   (char (*) [76])Args_2);
        pCVar16 = (Char *)std::__cxx11::string::c_str();
        Args_1_00 = (char (*) [77])0xac2;
        DebugAssertionFailed
                  (pCVar16,"MapTextureSubresource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xac2);
        std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
      }
      if ((pMapRegion->MaxZ == 0) || (pMapRegion->MaxY == 0)) {
        FormatString<char[26],char[47]>
                  ((string *)&BlockAlignedMaxY,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pMapRegion->MaxZ >= 1 && pMapRegion->MaxY >= 1",
                   (char (*) [47])Args_1_00);
        pCVar16 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar16,"MapTextureSubresource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xac5);
        std::__cxx11::string::~string((string *)&BlockAlignedMaxY);
      }
      tVar8 = AlignUp<unsigned_int,unsigned_int>(pMapRegion->MaxX,(uint)this_01->BlockWidth);
      tVar9 = AlignUp<unsigned_int,unsigned_int>(pMapRegion->MaxY,(uint)this_01->BlockHeight);
      lVar14 = MipLevelAttribs_1.MipSize +
               ((ulong)((pMapRegion->MaxZ - 1) * MipLevelAttribs_1.LogicalHeight +
                       (tVar9 - this_01->BlockHeight)) / (ulong)this_01->BlockHeight) *
               MipLevelAttribs_1._16_8_;
      bVar1 = this_01->BlockWidth;
      UVar7 = TextureFormatAttribs::GetElementSize(this_01);
      TextureVkImpl::InvalidateStagingRange
                (this_00,Offset,(lVar14 + ((ulong)tVar8 / (ulong)bVar1) * (ulong)UVar7) - Offset);
    }
    else if ((MapType == MAP_WRITE) &&
            (CVar6 = Diligent::operator&(TexDesc_00->CPUAccessFlags,CPU_ACCESS_FLAG_LAST),
            CVar6 == CPU_ACCESS_NONE)) {
      FormatString<char[10],char_const*,char[77]>
                ((string *)((long)&msg_3.field_2 + 8),(Diligent *)0xf4cd7e,(char (*) [10])TexDesc_00
                 ,(char **)
                  "\' was not created with CPU_ACCESS_WRITE flag and can\'t be mapped for writing",
                 Args_2);
      pCVar16 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar16,"MapTextureSubresource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xacf);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
  }
  else {
    local_300 = GetUsageString(TexDesc_00->Usage);
    FormatString<char_const*,char[56]>
              ((string *)local_2f8,(Diligent *)&local_300,
               (char **)" textures cannot currently be mapped in Vulkan back-end",Args_1);
    pCVar16 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar16,"MapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xad5);
    std::__cxx11::string::~string((string *)local_2f8);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::MapTextureSubresource(ITexture*                 pTexture,
                                                Uint32                    MipLevel,
                                                Uint32                    ArraySlice,
                                                MAP_TYPE                  MapType,
                                                MAP_FLAGS                 MapFlags,
                                                const Box*                pMapRegion,
                                                MappedTextureSubresource& MappedData)
{
    TDeviceContextBase::MapTextureSubresource(pTexture, MipLevel, ArraySlice, MapType, MapFlags, pMapRegion, MappedData);

    TextureVkImpl&              TextureVk  = *ClassPtrCast<TextureVkImpl>(pTexture);
    const TextureDesc&          TexDesc    = TextureVk.GetDesc();
    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);

    Box FullExtentBox;
    if (pMapRegion == nullptr)
    {
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);

        FullExtentBox.MaxX = MipLevelAttribs.LogicalWidth;
        FullExtentBox.MaxY = MipLevelAttribs.LogicalHeight;
        FullExtentBox.MaxZ = MipLevelAttribs.Depth;
        pMapRegion         = &FullExtentBox;
    }

    if (TexDesc.Usage == USAGE_DYNAMIC)
    {
        if (MapType != MAP_WRITE)
        {
            LOG_ERROR("Dynamic textures can be mapped for writing only in Vulkan backend");
            MappedData = MappedTextureSubresource{};
            return;
        }

        if ((MapFlags & (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE)) != 0)
            LOG_INFO_MESSAGE_ONCE("Mapping textures with flags MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE has no effect in Vulkan backend");

        const VkPhysicalDeviceLimits& DeviceLimits = m_pDevice->GetPhysicalDevice().GetProperties().limits;
        const BufferToTextureCopyInfo CopyInfo     = GetBufferToTextureCopyInfo(TexDesc.Format, *pMapRegion, static_cast<Uint32>(DeviceLimits.optimalBufferCopyRowPitchAlignment));
        // Source buffer offset must be multiple of 4 (18.4)
        VkDeviceSize Alignment = std::max(DeviceLimits.optimalBufferCopyOffsetAlignment, VkDeviceSize{4});
        // If the calling command's VkImage parameter is a compressed image, bufferOffset must be a multiple of
        // the compressed texel block size in bytes (18.4)
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
        {
            Alignment = std::max(Alignment, VkDeviceSize{FmtAttribs.ComponentSize});
        }
        if (VulkanDynamicAllocation Allocation = AllocateDynamicSpace(CopyInfo.MemorySize, static_cast<Uint32>(Alignment)))
        {
            MappedData.pData       = reinterpret_cast<Uint8*>(Allocation.pDynamicMemMgr->GetCPUAddress()) + Allocation.AlignedOffset;
            MappedData.Stride      = CopyInfo.RowStride;
            MappedData.DepthStride = CopyInfo.DepthStride;

            auto it = m_MappedTextures.emplace(MappedTextureKey{&TextureVk, MipLevel, ArraySlice}, MappedTexture{CopyInfo, std::move(Allocation)});
            if (!it.second)
                LOG_ERROR_MESSAGE("Mip level ", MipLevel, ", slice ", ArraySlice, " of texture '", TexDesc.Name, "' has already been mapped");
        }
    }
    else if (TexDesc.Usage == USAGE_STAGING)
    {
        Uint64 SubresourceOffset =
            GetStagingTextureSubresourceOffset(TexDesc, ArraySlice, MipLevel, TextureVkImpl::StagingBufferOffsetAlignment);
        const MipLevelProperties MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);
        // address of (x,y,z) = region->bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)
        Uint64 MapStartOffset = SubresourceOffset +
            // For compressed-block formats, RowSize is the size of one compressed row.
            // For non-compressed formats, BlockHeight is 1.
            (pMapRegion->MinZ * MipLevelAttribs.StorageHeight + pMapRegion->MinY) / FmtAttribs.BlockHeight * MipLevelAttribs.RowSize +
            // For non-compressed formats, BlockWidth is 1.
            pMapRegion->MinX / FmtAttribs.BlockWidth * Uint64{FmtAttribs.GetElementSize()};

        MappedData.pData       = TextureVk.GetStagingDataCPUAddress() + MapStartOffset;
        MappedData.Stride      = MipLevelAttribs.RowSize;
        MappedData.DepthStride = MipLevelAttribs.DepthSliceSize;

        if (MapType == MAP_READ)
        {
            if ((MapFlags & MAP_FLAG_DO_NOT_WAIT) == 0)
            {
                LOG_WARNING_MESSAGE("Vulkan backend never waits for GPU when mapping staging textures for reading. "
                                    "Applications must use fences or other synchronization methods to explicitly synchronize "
                                    "access and use MAP_FLAG_DO_NOT_WAIT flag.");
            }

            DEV_CHECK_ERR((TexDesc.CPUAccessFlags & CPU_ACCESS_READ), "Texture '", TexDesc.Name, "' was not created with CPU_ACCESS_READ flag and can't be mapped for reading");
            // Readback memory is not created with HOST_COHERENT flag, so we have to explicitly invalidate the mapped range
            // to make device writes visible to CPU reads
            VERIFY_EXPR(pMapRegion->MaxZ >= 1 && pMapRegion->MaxY >= 1);
            Uint32 BlockAlignedMaxX = AlignUp(pMapRegion->MaxX, Uint32{FmtAttribs.BlockWidth});
            Uint32 BlockAlignedMaxY = AlignUp(pMapRegion->MaxY, Uint32{FmtAttribs.BlockHeight});
            Uint64 MapEndOffset     = SubresourceOffset +
                ((pMapRegion->MaxZ - 1) * MipLevelAttribs.StorageHeight + (BlockAlignedMaxY - FmtAttribs.BlockHeight)) / FmtAttribs.BlockHeight * MipLevelAttribs.RowSize +
                (BlockAlignedMaxX / FmtAttribs.BlockWidth) * Uint64{FmtAttribs.GetElementSize()};
            TextureVk.InvalidateStagingRange(MapStartOffset, MapEndOffset - MapStartOffset);
        }
        else if (MapType == MAP_WRITE)
        {
            DEV_CHECK_ERR((TexDesc.CPUAccessFlags & CPU_ACCESS_WRITE), "Texture '", TexDesc.Name, "' was not created with CPU_ACCESS_WRITE flag and can't be mapped for writing");
            // Nothing needs to be done when mapping texture for writing
        }
    }
    else
    {
        UNSUPPORTED(GetUsageString(TexDesc.Usage), " textures cannot currently be mapped in Vulkan back-end");
    }
}